

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

Ivy_Obj_t * Ivy_ObjReal(Ivy_Obj_t *pObj)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pFanin;
  Ivy_Obj_t *pObj_local;
  
  pObj_local = pObj;
  if (pObj != (Ivy_Obj_t *)0x0) {
    pIVar2 = Ivy_Regular(pObj);
    iVar1 = Ivy_ObjIsBuf(pIVar2);
    if (iVar1 != 0) {
      pIVar2 = Ivy_Regular(pObj);
      pIVar2 = Ivy_ObjChild0(pIVar2);
      pIVar2 = Ivy_ObjReal(pIVar2);
      iVar1 = Ivy_IsComplement(pObj);
      pObj_local = Ivy_NotCond(pIVar2,iVar1);
    }
  }
  return pObj_local;
}

Assistant:

Ivy_Obj_t * Ivy_ObjReal( Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pFanin;
    if ( pObj == NULL || !Ivy_ObjIsBuf( Ivy_Regular(pObj) ) )
        return pObj;
    pFanin = Ivy_ObjReal( Ivy_ObjChild0(Ivy_Regular(pObj)) );
    return Ivy_NotCond( pFanin, Ivy_IsComplement(pObj) );
}